

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O1

void CoreML::KNNValidatorTests::addIntLabels(KNearestNeighborsClassifier *nnModel)

{
  int iVar1;
  Int64Vector *pIVar2;
  
  if (nnModel->_oneof_case_[0] != 0x65) {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar2 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar2);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar2;
  }
  pIVar2 = (nnModel->ClassLabels_).int64classlabels_;
  iVar1 = (pIVar2->vector_).total_size_;
  if ((pIVar2->vector_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar2->vector_,iVar1 + 1);
  }
  iVar1 = (pIVar2->vector_).current_size_;
  (pIVar2->vector_).current_size_ = iVar1 + 1;
  ((pIVar2->vector_).rep_)->elements[iVar1] = 0;
  if (nnModel->_oneof_case_[0] != 0x65) {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar2 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar2);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar2;
  }
  pIVar2 = (nnModel->ClassLabels_).int64classlabels_;
  iVar1 = (pIVar2->vector_).total_size_;
  if ((pIVar2->vector_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar2->vector_,iVar1 + 1);
  }
  iVar1 = (pIVar2->vector_).current_size_;
  (pIVar2->vector_).current_size_ = iVar1 + 1;
  ((pIVar2->vector_).rep_)->elements[iVar1] = 0;
  if (nnModel->_oneof_case_[0] != 0x65) {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar2 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar2);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar2;
  }
  pIVar2 = (nnModel->ClassLabels_).int64classlabels_;
  iVar1 = (pIVar2->vector_).total_size_;
  if ((pIVar2->vector_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar2->vector_,iVar1 + 1);
  }
  iVar1 = (pIVar2->vector_).current_size_;
  (pIVar2->vector_).current_size_ = iVar1 + 1;
  ((pIVar2->vector_).rep_)->elements[iVar1] = 0;
  if (nnModel->_oneof_case_[0] != 0x65) {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar2 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar2);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar2;
  }
  pIVar2 = (nnModel->ClassLabels_).int64classlabels_;
  iVar1 = (pIVar2->vector_).total_size_;
  if ((pIVar2->vector_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar2->vector_,iVar1 + 1);
  }
  iVar1 = (pIVar2->vector_).current_size_;
  (pIVar2->vector_).current_size_ = iVar1 + 1;
  ((pIVar2->vector_).rep_)->elements[iVar1] = 0;
  if (nnModel->_oneof_case_[0] != 0x65) {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar2 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar2);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar2;
  }
  pIVar2 = (nnModel->ClassLabels_).int64classlabels_;
  iVar1 = (pIVar2->vector_).total_size_;
  if ((pIVar2->vector_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar2->vector_,iVar1 + 1);
  }
  iVar1 = (pIVar2->vector_).current_size_;
  (pIVar2->vector_).current_size_ = iVar1 + 1;
  ((pIVar2->vector_).rep_)->elements[iVar1] = 0;
  if (nnModel->_oneof_case_[0] != 0x65) {
    Specification::KNearestNeighborsClassifier::clear_ClassLabels(nnModel);
    nnModel->_oneof_case_[0] = 0x65;
    pIVar2 = (Int64Vector *)operator_new(0x28);
    Specification::Int64Vector::Int64Vector(pIVar2);
    (nnModel->ClassLabels_).int64classlabels_ = pIVar2;
  }
  pIVar2 = (nnModel->ClassLabels_).int64classlabels_;
  iVar1 = (pIVar2->vector_).total_size_;
  if ((pIVar2->vector_).current_size_ == iVar1) {
    google::protobuf::RepeatedField<long>::Reserve(&pIVar2->vector_,iVar1 + 1);
  }
  iVar1 = (pIVar2->vector_).current_size_;
  (pIVar2->vector_).current_size_ = iVar1 + 1;
  ((pIVar2->vector_).rep_)->elements[iVar1] = 0;
  return;
}

Assistant:

void addIntLabels(Specification::KNearestNeighborsClassifier* nnModel) {

        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);

        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);
        nnModel->mutable_int64classlabels()->add_vector(0);

    }